

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int __thiscall CServer::GetClientInfo(CServer *this,int ClientID,CClientInfo *pInfo)

{
  bool bVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                 ,0x184,(uint)((uint)ClientID < 0x40),"client_id is not valid");
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/server/server.cpp"
                 ,0x185,(uint)(pInfo != (CClientInfo *)0x0),"info can not be null");
  bVar1 = this->m_aClients[ClientID].m_State == 5;
  if (bVar1) {
    pInfo->m_pName = this->m_aClients[ClientID].m_aName;
    pInfo->m_Latency = this->m_aClients[ClientID].m_Latency;
  }
  return (uint)bVar1;
}

Assistant:

int CServer::GetClientInfo(int ClientID, CClientInfo *pInfo) const
{
	dbg_assert(ClientID >= 0 && ClientID < MAX_CLIENTS, "client_id is not valid");
	dbg_assert(pInfo != 0, "info can not be null");

	if(m_aClients[ClientID].m_State == CClient::STATE_INGAME)
	{
		pInfo->m_pName = m_aClients[ClientID].m_aName;
		pInfo->m_Latency = m_aClients[ClientID].m_Latency;
		return 1;
	}
	return 0;
}